

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

void cleanup_class(void)

{
  player_class *ppVar1;
  start_item *psVar2;
  class_book *p;
  class_spell *p_00;
  player_class *p_01;
  uint uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  start_item *p_02;
  
  p_01 = classes;
  while (p_01 != (player_class *)0x0) {
    ppVar1 = p_01->next;
    p_02 = p_01->start_items;
    while (p_02 != (start_item *)0x0) {
      psVar2 = p_02->next;
      mem_free(p_02->eopts);
      mem_free(p_02);
      p_02 = psVar2;
    }
    for (lVar4 = 0; p = (p_01->magic).books, lVar4 < (p_01->magic).num_books; lVar4 = lVar4 + 1) {
      lVar5 = 0x10;
      for (lVar6 = 0; p_00 = p[lVar4].spells, lVar6 < p[lVar4].num_spells; lVar6 = lVar6 + 1) {
        string_free(*(char **)((long)p_00 + lVar5 + -0x10));
        string_free(*(char **)((long)p_00 + lVar5 + -8));
        free_effect(*(effect **)((long)&p_00->name + lVar5));
        lVar5 = lVar5 + 0x38;
      }
      mem_free(p_00);
    }
    mem_free(p);
    for (uVar3 = 9; -1 < (int)uVar3; uVar3 = uVar3 - 1) {
      string_free(p_01->title[uVar3]);
    }
    string_free(p_01->name);
    mem_free(p_01);
    p_01 = ppVar1;
  }
  return;
}

Assistant:

static void cleanup_class(void)
{
	struct player_class *c = classes;
	struct player_class *next;
	struct start_item *item, *item_next;
	struct class_spell *spell;
	struct class_book *book;
	int i, j;

	while (c) {
		next = c->next;
		item = c->start_items;
		while(item) {
			item_next = item->next;
			mem_free(item->eopts);
			mem_free(item);
			item = item_next;
		}
		for (i = 0; i < c->magic.num_books; i++) {
			book = &c->magic.books[i];
			for (j = 0; j < book->num_spells; j++) {
				spell = &book->spells[j];
				string_free(spell->name);
				string_free(spell->text);
				free_effect(spell->effect);
			}
			mem_free(book->spells);
		}
		mem_free(c->magic.books);
		for (i = (int) N_ELEMENTS(c->title) - 1; i >= 0; --i) {
			string_free((char *)c->title[i]);
		}
		string_free((char *)c->name);
		mem_free(c);
		c = next;
	}
}